

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O3

void REVassoc_store_action_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  EVaction EVar1;
  CMFormat format;
  EV_int_response response;
  undefined4 local_28;
  EVaction local_24;
  
  format = CMlookup_format(conn->cm,EV_int_response_formats);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EV_int_response_formats);
  }
  EVar1 = EVassoc_store_action
                    (cm,*(EVstone *)((long)data + 4),*(EVstone *)((long)data + 8),
                     *(int *)((long)data + 0xc));
  _local_28 = CONCAT44(EVar1,*data);
  CMwrite(conn,format,&local_28);
  return;
}

Assistant:

static void
REVassoc_store_action_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVassoc_store_action_request *request = (EVassoc_store_action_request *) data;
    EVaction ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    ret = EVassoc_store_action(cm, request->stone_num, request->out_stone, request->store_limit);
    response.ret = (int) ret;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}